

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

ProgramSources *
deqp::gls::Functional::anon_unknown_0::genShaders
          (ProgramSources *__return_storage_ptr__,GLSLVersion version)

{
  mapped_type *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string frgSource;
  string vtxSource;
  key_type local_100;
  StringTemplate local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  StringTemplate local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "${VERSION}\n${IN} highp vec4 a_position;\nvoid main(){\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "${VERSION}\n${OUT_DECL}uniform highp vec4 u_color;\nvoid main(){\n\t${OUTPUT} = u_color;\n}\n"
             ,(allocator<char> *)&local_c0);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (version - GLSL_VERSION_300_ES < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"VERSION",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"IN",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"OUT_DECL",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"OUTPUT",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
  }
  else {
    if (version != GLSL_VERSION_100_ES) goto LAB_008381d1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"VERSION",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"IN",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"OUT_DECL",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"OUTPUT",(allocator<char> *)&local_e0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_c0,&local_100);
    std::__cxx11::string::assign((char *)pmVar1);
  }
  std::__cxx11::string::~string((string *)&local_100);
LAB_008381d1:
  tcu::StringTemplate::StringTemplate(&local_e0,&local_30);
  tcu::StringTemplate::specialize
            (&local_100,&local_e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_c0);
  tcu::StringTemplate::StringTemplate(&local_90,&local_50);
  tcu::StringTemplate::specialize
            (&local_70,&local_90,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_c0);
  glu::makeVtxFragSources(__return_storage_ptr__,&local_100,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  tcu::StringTemplate::~StringTemplate(&local_90);
  std::__cxx11::string::~string((string *)&local_100);
  tcu::StringTemplate::~StringTemplate(&local_e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

glu::ProgramSources genShaders(glu::GLSLVersion version)
{
	const string vtxSource = "${VERSION}\n"
							 "${IN} highp vec4 a_position;\n"
							 "void main(){\n"
							 "	gl_Position = a_position;\n"
							 "}\n";

	const string frgSource = "${VERSION}\n"
							 "${OUT_DECL}"
							 "uniform highp vec4 u_color;\n"
							 "void main(){\n"
							 "	${OUTPUT} = u_color;\n"
							 "}\n";

	map<string, string>	params;

	switch(version)
	{
		case glu::GLSL_VERSION_100_ES:
			params["VERSION"] = "#version 100";
			params["IN"] = "attribute";
			params["OUT_DECL"] = "";
			params["OUTPUT"] = "gl_FragColor";
			break;

		case glu::GLSL_VERSION_300_ES:
		case glu::GLSL_VERSION_310_ES: // Assumed to support 3.0
			params["VERSION"] = "#version 300 es";
			params["IN"] = "in";
			params["OUT_DECL"] = "out mediump vec4 f_color;\n";
			params["OUTPUT"] = "f_color";
			break;

		default:
			DE_FATAL("Unsupported version");
	}

	return glu::makeVtxFragSources(tcu::StringTemplate(vtxSource).specialize(params), tcu::StringTemplate(frgSource).specialize(params));
}